

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_6::TwoLevelIterator::status(TwoLevelIterator *this)

{
  Iterator *pIVar1;
  long in_RSI;
  Iterator *local_30;
  
  IteratorWrapper::status((IteratorWrapper *)&local_30);
  pIVar1 = local_30;
  Status::~Status((Status *)&local_30);
  if (pIVar1 == (Iterator *)0x0) {
    if (*(long *)(in_RSI + 0x70) != 0) {
      IteratorWrapper::status((IteratorWrapper *)&local_30);
      Status::~Status((Status *)&local_30);
      if (local_30 != (Iterator *)0x0) goto LAB_0011958a;
    }
    Status::Status((Status *)this,(Status *)(in_RSI + 0x48));
  }
  else {
LAB_0011958a:
    IteratorWrapper::status((IteratorWrapper *)this);
  }
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    // It'd be nice if status() returned a const Status& instead of a Status
    if (!index_iter_.status().ok()) {
      return index_iter_.status();
    } else if (data_iter_.iter() != nullptr && !data_iter_.status().ok()) {
      return data_iter_.status();
    } else {
      return status_;
    }
  }